

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

void __thiscall CUI::ConvertCursorMove(CUI *this,float *pX,float *pY,int CursorType)

{
  long lVar1;
  float fVar2;
  
  if (CursorType == 1) {
    lVar1 = 0x568;
  }
  else {
    if (CursorType != 2) {
      fVar2 = 1.0;
      goto LAB_0018a71e;
    }
    lVar1 = 0x56c;
  }
  fVar2 = (float)*(int *)((long)&this->m_pConfig->m_ClPredict + lVar1) / 100.0;
LAB_0018a71e:
  *pX = *pX * fVar2;
  *pY = fVar2 * *pY;
  return;
}

Assistant:

void CUI::ConvertCursorMove(float *pX, float *pY, int CursorType) const
{
	float Factor = 1.0f;
	switch(CursorType)
	{
		case IInput::CURSOR_MOUSE:
			Factor = Config()->m_UiMousesens/100.0f;
			break;
		case IInput::CURSOR_JOYSTICK:
			Factor = Config()->m_UiJoystickSens/100.0f;
			break;
	}
	*pX *= Factor;
	*pY *= Factor;
}